

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  xml_attribute_struct *attr;
  bool bVar1;
  xml_attribute local_20;
  
  if (this->_root != (xml_node_struct *)0x0) {
    for (attr = this->_root->first_attribute; attr != (xml_attribute_struct *)0x0;
        attr = attr->next_attribute) {
      if ((attr->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,attr->name), bVar1)) {
        xml_attribute::xml_attribute(&local_20,attr);
        if (attr != (xml_attribute_struct *)0x0) {
          return (xml_attribute)local_20._attr;
        }
        break;
      }
    }
  }
  xml_attribute::xml_attribute(&local_20);
  return (xml_attribute)local_20._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_attribute(i);
		}

		return xml_attribute();
	}